

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::processIfOneOpReg(Assembler *this,string *line,int reg)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *pmVar5;
  allocator<char> local_81;
  string local_80;
  value_type local_60;
  byte local_5f;
  value_type local_5e;
  value_type local_5d [20];
  allocator<char> local_49;
  string local_48;
  value_type local_26;
  byte local_25;
  value_type local_24;
  value_type local_23;
  char local_22;
  value_type local_21;
  value_type local_20;
  char local_1f;
  value_type local_1e;
  value_type local_1d;
  int local_1c;
  string *psStack_18;
  int reg_local;
  string *line_local;
  Assembler *this_local;
  
  local_1c = reg;
  psStack_18 = line;
  line_local = &this->inputFileName;
  bVar1 = std::operator==(line,"int");
  if (bVar1) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
    local_1d = (value_type)locationCounter;
    std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_1d);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->instrDescription,line);
    local_1e = (value_type)*pmVar4;
    std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_1e);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
    local_1f = (char)(local_1c << 4) + '\x0f';
    std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_1f);
  }
  else {
    bVar1 = std::operator==(line,"not");
    if (bVar1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
      local_20 = (value_type)locationCounter;
      std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_20);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->instrDescription,line);
      local_21 = (value_type)*pmVar4;
      std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_21);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
      local_22 = (char)(local_1c << 4) + '\x0f';
      std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_22);
    }
    else {
      bVar1 = std::operator==(line,"pop");
      if (bVar1) {
        pmVar5 = &this->codeBySection;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
        local_23 = (value_type)locationCounter;
        std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_23);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->instrDescription,line);
        local_24 = (value_type)*pmVar4;
        std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_24);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
        local_25 = (char)local_1c << 4 | 6;
        std::vector<char,_std::allocator<char>_>::push_back(pmVar3,(value_type *)&local_25);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"0x42",&local_49);
        iVar2 = literalToDecimal(this,&local_48);
        local_26 = (value_type)iVar2;
        std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_26);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator(&local_49);
      }
      else {
        bVar1 = std::operator==(line,"push");
        if (bVar1) {
          pmVar5 = &this->codeBySection;
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
          local_5d[0] = (value_type)locationCounter;
          std::vector<char,_std::allocator<char>_>::push_back(pmVar3,local_5d);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&this->instrDescription,line);
          local_5e = (value_type)*pmVar4;
          std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_5e);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
          local_5f = (char)local_1c << 4 | 6;
          std::vector<char,_std::allocator<char>_>::push_back(pmVar3,(value_type *)&local_5f);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar5,&currentSectionName_abi_cxx11_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"0x12",&local_81);
          iVar2 = literalToDecimal(this,&local_80);
          local_60 = (value_type)iVar2;
          std::vector<char,_std::allocator<char>_>::push_back(pmVar3,&local_60);
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator(&local_81);
        }
      }
    }
  }
  return;
}

Assistant:

void Assembler::processIfOneOpReg(string line, int reg) {
    if (line == "int") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 15);

    } else if (line == "not") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 15);

    } else if (line == "pop") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 6);
        codeBySection[currentSectionName].push_back(literalToDecimal("0x42"));

    } else if (line == "push") {
        codeBySection[currentSectionName].push_back(locationCounter);
        codeBySection[currentSectionName].push_back(instrDescription[line]);
        codeBySection[currentSectionName].push_back((reg << 4) + 6);
        codeBySection[currentSectionName].push_back(literalToDecimal("0x12"));

    }

    return;

}